

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_>::NewKey
          (TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this,
          int key)

{
  Node *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 uVar6;
  FName FVar7;
  short sVar8;
  char cVar9;
  undefined1 uVar10;
  int iVar11;
  undefined4 uVar12;
  Node *pNVar13;
  uint uVar14;
  Node *pNVar15;
  uint uVar16;
  Node *pNVar17;
  Node *pNVar18;
  Node *pNVar19;
  
  pNVar13 = this->Nodes;
  uVar14 = this->Size - 1;
  uVar16 = uVar14 & key;
  pNVar19 = pNVar13 + uVar16;
  pNVar15 = pNVar13[uVar16].Next;
  if (pNVar15 == (Node *)0x1) {
    pNVar19->Next = (Node *)0x0;
  }
  else {
    pNVar1 = this->LastFree;
    do {
      pNVar17 = pNVar1 + -1;
      pNVar18 = (Node *)0x0;
      if (pNVar1 <= pNVar13) break;
      pNVar18 = pNVar17;
      pNVar1 = pNVar17;
    } while (pNVar17->Next != (Node *)0x1);
    this->LastFree = pNVar17;
    if (pNVar18 == (Node *)0x0) {
      Resize(this,this->Size * 2);
      pNVar13 = NewKey(this,key);
    }
    else {
      uVar14 = uVar14 & (pNVar19->Pair).Key;
      if (uVar14 == uVar16) {
        pNVar18->Next = pNVar15;
        pNVar13 = pNVar18;
        pNVar15 = pNVar18;
      }
      else {
        pNVar13 = pNVar13 + uVar14;
        do {
          pNVar15 = pNVar13;
          pNVar13 = pNVar15->Next;
        } while (pNVar13 != pNVar19);
        pNVar15->Next = pNVar18;
        pNVar13 = pNVar19->Next;
        iVar11 = (pNVar19->Pair).Key;
        uVar12 = *(undefined4 *)&(pNVar19->Pair).field_0x4;
        FVar7.Index = (pNVar19->Pair).Value.classname.Index;
        sVar8 = (pNVar19->Pair).Value.special;
        cVar9 = (pNVar19->Pair).Value.argsdefined;
        uVar10 = (pNVar19->Pair).Value.field_0x7;
        uVar2 = *(undefined8 *)(pNVar19->Pair).Value.args;
        uVar3 = *(undefined8 *)((pNVar19->Pair).Value.args + 2);
        uVar4 = *(undefined8 *)((pNVar19->Pair).Value.args + 4);
        iVar5 = (pNVar19->Pair).Value.linenum;
        uVar6 = *(undefined4 *)&(pNVar19->Pair).Value.field_0x2c;
        (pNVar18->Pair).Value.filename.Chars = (pNVar19->Pair).Value.filename.Chars;
        (pNVar18->Pair).Value.linenum = iVar5;
        *(undefined4 *)&(pNVar18->Pair).Value.field_0x2c = uVar6;
        *(undefined8 *)((pNVar18->Pair).Value.args + 2) = uVar3;
        *(undefined8 *)((pNVar18->Pair).Value.args + 4) = uVar4;
        (pNVar18->Pair).Value.classname = (FName)FVar7.Index;
        (pNVar18->Pair).Value.special = sVar8;
        (pNVar18->Pair).Value.argsdefined = cVar9;
        (pNVar18->Pair).Value.field_0x7 = uVar10;
        *(undefined8 *)(pNVar18->Pair).Value.args = uVar2;
        pNVar18->Next = pNVar13;
        (pNVar18->Pair).Key = iVar11;
        *(undefined4 *)&(pNVar18->Pair).field_0x4 = uVar12;
        pNVar13 = (Node *)0x0;
        pNVar15 = pNVar19;
      }
      pNVar19->Next = pNVar13;
      pNVar19 = pNVar15;
    }
    if (pNVar18 == (Node *)0x0) {
      return pNVar13;
    }
  }
  this->NumUsed = this->NumUsed + 1;
  (pNVar19->Pair).Key = key;
  return pNVar19;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}